

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int fts5StorageCount(Fts5Storage *p,char *zSuffix,i64 *pnRow)

{
  Fts5Config *pFVar1;
  sqlite3_stmt *pStmt;
  int iVar2;
  char *zSql;
  Mem *pMem;
  i64 iVar3;
  long in_FS_OFFSET;
  sqlite3_stmt *pCnt;
  sqlite3_stmt *local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  pFVar1 = p->pConfig;
  zSql = sqlite3_mprintf("SELECT count(*) FROM %Q.\'%q_%s\'",pFVar1->zDb,pFVar1->zName,zSuffix);
  if (zSql == (char *)0x0) {
    iVar2 = 7;
  }
  else {
    local_38 = (sqlite3_stmt *)0x0;
    iVar2 = sqlite3LockAndPrepare(pFVar1->db,zSql,-1,0x80,(Vdbe *)0x0,&local_38,(char **)0x0);
    pStmt = local_38;
    if (iVar2 == 0) {
      iVar2 = sqlite3_step(local_38);
      if (iVar2 == 100) {
        pMem = columnMem(pStmt,0);
        iVar3 = sqlite3VdbeIntValue(pMem);
        columnMallocFailure(pStmt);
        *pnRow = iVar3;
      }
      iVar2 = sqlite3_finalize(pStmt);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    sqlite3_free(zSql);
    return iVar2;
  }
  __stack_chk_fail();
}

Assistant:

static int fts5StorageCount(Fts5Storage *p, const char *zSuffix, i64 *pnRow){
  Fts5Config *pConfig = p->pConfig;
  char *zSql;
  int rc;

  zSql = sqlite3_mprintf("SELECT count(*) FROM %Q.'%q_%s'",
      pConfig->zDb, pConfig->zName, zSuffix
  );
  if( zSql==0 ){
    rc = SQLITE_NOMEM;
  }else{
    sqlite3_stmt *pCnt = 0;
    rc = sqlite3_prepare_v2(pConfig->db, zSql, -1, &pCnt, 0);
    if( rc==SQLITE_OK ){
      if( SQLITE_ROW==sqlite3_step(pCnt) ){
        *pnRow = sqlite3_column_int64(pCnt, 0);
      }
      rc = sqlite3_finalize(pCnt);
    }
  }

  sqlite3_free(zSql);
  return rc;
}